

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  byte bVar4;
  char *pcVar5;
  size_t i;
  ulong uVar6;
  
  uVar6 = 0;
  do {
    if ((this->m_str)._M_string_length <= uVar6) {
      return;
    }
    pcVar1 = (this->m_str)._M_dataplus._M_p;
    bVar4 = pcVar1[uVar6];
    if (bVar4 == 0x22) {
      if (this->m_forWhat != ForAttributes) {
        bVar4 = 0x22;
        goto LAB_0013479e;
      }
      pcVar5 = "&quot;";
LAB_00134715:
      std::operator<<(os,pcVar5);
    }
    else {
      if (bVar4 == 0x26) {
        pcVar5 = "&amp;";
        goto LAB_00134715;
      }
      if (bVar4 == 0x3e) {
        if (((2 < uVar6) && (pcVar1[uVar6 - 1] == ']')) && (pcVar1[uVar6 - 2] == ']')) {
          pcVar5 = "&gt;";
          goto LAB_00134715;
        }
        bVar4 = 0x3e;
LAB_0013479e:
        std::operator<<(os,bVar4);
      }
      else {
        if (bVar4 == 0x3c) {
          pcVar5 = "&lt;";
          goto LAB_00134715;
        }
        if ((8 < bVar4) && (bVar4 != 0x7f && 0x11 < (byte)(bVar4 - 0xe))) goto LAB_0013479e;
        poVar3 = std::operator<<(os,"\\x");
        lVar2 = *(long *)poVar3;
        *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
        poVar3 = std::operator<<(poVar3,0x30);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
        std::ostream::operator<<(poVar3,(int)(char)bVar4);
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465 and
                        // by @mrpi PR #588
                        if ( ( c >= 0 && c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' ) {
                            // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                            os << "\\x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
                               << static_cast<int>( c );
                        }
                        else
                            os << c;
                }
            }
        }